

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::validate_header
          (HL1MDLLoader *this,Header_HL1 *header,bool is_texture_header)

{
  int iVar1;
  Logger *pLVar2;
  DeadlyImportError *pDVar3;
  undefined7 in_register_00000011;
  int __val;
  string *this_00;
  allocator<char> local_19a;
  allocator<char> local_199;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000011,is_texture_header) == 0) {
    iVar1 = header->numbodyparts;
    if (iVar1 == 0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"[Half-Life 1 MDL] Model has no bodyparts",
                 (allocator<char> *)&local_178);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_198);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    __val = header->numbones;
    if (__val == 0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"[Half-Life 1 MDL] Model has no bones",
                 (allocator<char> *)&local_178);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_198);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (header->numseqgroups == 0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"[Half-Life 1 MDL] Model has no sequence groups",
                 (allocator<char> *)&local_178);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_198);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0x20 < iVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"bodyparts",(allocator<char> *)&local_178);
      log_warning_limit_exceeded<32>(iVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      __val = header->numbones;
    }
    if (0x80 < __val) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"bones",&local_19a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Model",&local_199);
      pLVar2 = DefaultLogger::get();
      std::operator+(&local_d8,"[Half-Life 1 MDL] ",&local_138);
      std::operator+(&local_b8,&local_d8," has ");
      std::__cxx11::to_string(&local_f8,__val);
      std::operator+(&local_98,&local_b8,&local_f8);
      std::operator+(&local_78,&local_98," ");
      std::operator+(&local_58,&local_78,&local_158);
      std::operator+(&local_38,&local_58,", which exceeds the limit (");
      std::__cxx11::to_string(&local_118,0x80);
      std::operator+(&local_178,&local_38,&local_118);
      std::operator+(&local_198,&local_178,")");
      Logger::warn(pLVar2,local_198._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
    }
    iVar1 = header->numbonecontrollers;
    if (8 < iVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"bone controllers",&local_19a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Model",&local_199);
      pLVar2 = DefaultLogger::get();
      std::operator+(&local_d8,"[Half-Life 1 MDL] ",&local_138);
      std::operator+(&local_b8,&local_d8," has ");
      std::__cxx11::to_string(&local_f8,iVar1);
      std::operator+(&local_98,&local_b8,&local_f8);
      std::operator+(&local_78,&local_98," ");
      std::operator+(&local_58,&local_78,&local_158);
      std::operator+(&local_38,&local_58,", which exceeds the limit (");
      std::__cxx11::to_string(&local_118,8);
      std::operator+(&local_178,&local_38,&local_118);
      std::operator+(&local_198,&local_178,")");
      Logger::warn(pLVar2,local_198._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
    }
    iVar1 = header->numseq;
    if (0x800 < iVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"sequences",(allocator<char> *)&local_178);
      log_warning_limit_exceeded<2048>(iVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    iVar1 = header->numseqgroups;
    if (0x20 < iVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"sequence groups",(allocator<char> *)&local_178);
      log_warning_limit_exceeded<32>(iVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    iVar1 = header->numattachments;
    if (iVar1 < 0x201) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"attachments",&local_19a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Model",&local_199);
    pLVar2 = DefaultLogger::get();
    std::operator+(&local_d8,"[Half-Life 1 MDL] ",&local_138);
    std::operator+(&local_b8,&local_d8," has ");
    std::__cxx11::to_string(&local_f8,iVar1);
    std::operator+(&local_98,&local_b8,&local_f8);
    std::operator+(&local_78,&local_98," ");
    std::operator+(&local_58,&local_78,&local_158);
    std::operator+(&local_38,&local_58,", which exceeds the limit (");
    std::__cxx11::to_string(&local_118,0x200);
    std::operator+(&local_178,&local_38,&local_118);
    std::operator+(&local_198,&local_178,")");
    Logger::warn(pLVar2,local_198._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_138);
    this_00 = &local_158;
  }
  else {
    iVar1 = header->numtextures;
    if (iVar1 == 0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"[Half-Life 1 MDL] There are no textures in the file",
                 (allocator<char> *)&local_178);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_198);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (100 < iVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"textures",(allocator<char> *)&local_178);
      log_warning_limit_exceeded<100>(iVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    iVar1 = header->numskinfamilies;
    if (iVar1 < 0x65) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"skin families",(allocator<char> *)&local_178);
    log_warning_limit_exceeded<100>(iVar1,&local_198);
    this_00 = &local_198;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void HL1MDLLoader::validate_header(const Header_HL1 *header, bool is_texture_header) {
    if (is_texture_header) {
        // Every single Half-Life model is assumed to have at least one texture.
        if (!header->numtextures)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "There are no textures in the file");

        if (header->numtextures > AI_MDL_HL1_MAX_TEXTURES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_TEXTURES>(header->numtextures, "textures");

        if (header->numskinfamilies > AI_MDL_HL1_MAX_SKIN_FAMILIES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SKIN_FAMILIES>(header->numskinfamilies, "skin families");

    } else {
        // Every single Half-Life model is assumed to have at least one bodypart.
        if (!header->numbodyparts)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no bodyparts");

        // Every single Half-Life model is assumed to have at least one bone.
        if (!header->numbones)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no bones");

        // Every single Half-Life model is assumed to have at least one sequence group,
        // which is the "default" sequence group.
        if (!header->numseqgroups)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no sequence groups");

        if (header->numbodyparts > AI_MDL_HL1_MAX_BODYPARTS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BODYPARTS>(header->numbodyparts, "bodyparts");

        if (header->numbones > AI_MDL_HL1_MAX_BONES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BONES>(header->numbones, "bones");

        if (header->numbonecontrollers > AI_MDL_HL1_MAX_BONE_CONTROLLERS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BONE_CONTROLLERS>(header->numbonecontrollers, "bone controllers");

        if (header->numseq > AI_MDL_HL1_MAX_SEQUENCES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SEQUENCES>(header->numseq, "sequences");

        if (header->numseqgroups > AI_MDL_HL1_MAX_SEQUENCE_GROUPS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SEQUENCE_GROUPS>(header->numseqgroups, "sequence groups");

        if (header->numattachments > AI_MDL_HL1_MAX_ATTACHMENTS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_ATTACHMENTS>(header->numattachments, "attachments");
    }
}